

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O0

bool get_max_cover_static1<512ul>
               (vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *sets,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *names,vector<unsigned_long,_std::allocator<unsigned_long>_> *_begin,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *_end,size_t k,
               bool print_progress)

{
  ostream *poVar1;
  code *local_48;
  _func_void_vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_ptr_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_ptr_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr_bool
  *fn;
  bool print_progress_local;
  size_t k_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *_end_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *_begin_local;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *names_local;
  vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *sets_local;
  
  if (k == 1) {
    local_48 = get_max_cover_static2<512ul,1>;
  }
  else if (k == 2) {
    local_48 = get_max_cover_static2<512ul,2>;
  }
  else if (k == 3) {
    local_48 = get_max_cover_static2<512ul,3>;
  }
  else if (k == 4) {
    local_48 = get_max_cover_static2<512ul,4>;
  }
  else if (k == 5) {
    local_48 = get_max_cover_static2<512ul,5>;
  }
  else if (k == 6) {
    local_48 = get_max_cover_static2<512ul,6>;
  }
  else if (k == 7) {
    local_48 = get_max_cover_static2<512ul,7>;
  }
  else if (k == 8) {
    local_48 = get_max_cover_static2<512ul,8>;
  }
  else if (k == 9) {
    local_48 = get_max_cover_static2<512ul,9>;
  }
  else {
    if (k != 10) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"size of the collection is too big: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,k);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      return false;
    }
    local_48 = get_max_cover_static2<512ul,10>;
  }
  (*local_48)(sets,names,_begin,_end,print_progress);
  return true;
}

Assistant:

bool get_max_cover_static1(const std::vector<Set>& sets, const std::unordered_map<std::string, size_t>& names,
    const std::vector<size_t>& _begin, const std::vector<size_t>& _end, size_t k, bool print_progress = false)
{
    auto fn = get_max_cover_static2<n, 1>;

         if (k == 1) fn = get_max_cover_static2<n, 1>;
    else if (k == 2) fn = get_max_cover_static2<n, 2>;
    else if (k == 3) fn = get_max_cover_static2<n, 3>;
    else if (k == 4) fn = get_max_cover_static2<n, 4>;
    else if (k == 5) fn = get_max_cover_static2<n, 5>;
    else if (k == 6) fn = get_max_cover_static2<n, 6>;
    else if (k == 7) fn = get_max_cover_static2<n, 7>;
    else if (k == 8) fn = get_max_cover_static2<n, 8>;
    else if (k == 9) fn = get_max_cover_static2<n, 9>;
    else if (k == 10) fn = get_max_cover_static2<n, 10>;
    else
    {
        std::cerr << "size of the collection is too big: " << k << std::endl;
        return false;
    }
    
    fn(sets, names, _begin, _end, print_progress);

    return true;
}